

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O2

void __thiscall jpge::jpeg_encoder::emit_sof(jpeg_encoder *this)

{
  ulong uVar1;
  ulong uVar2;
  
  emit_marker(this,0xc0);
  emit_word(this,(uint)this->m_num_components + (uint)this->m_num_components * 2 + 8);
  emit_byte(this,'\b');
  emit_word(this,this->m_image_y);
  emit_word(this,this->m_image_x);
  emit_byte(this,this->m_num_components);
  uVar2 = 0;
  while (uVar2 < this->m_num_components) {
    uVar1 = uVar2 + 1;
    emit_byte(this,(uint8)uVar1);
    emit_byte(this,this->m_comp_h_samp[uVar2] * '\x10' + this->m_comp_v_samp[uVar2]);
    emit_byte(this,uVar1 != 1);
    uVar2 = uVar1;
  }
  return;
}

Assistant:

void jpeg_encoder::emit_sof()
	{
		emit_marker(M_SOF0);                           /* baseline */
		emit_word(3 * m_num_components + 2 + 5 + 1);
		emit_byte(8);                                  /* precision */
		emit_word(m_image_y);
		emit_word(m_image_x);
		emit_byte(m_num_components);
		for (int i = 0; i < m_num_components; i++)
		{
			emit_byte(static_cast<uint8>(i + 1));                                   /* component ID     */
			emit_byte((m_comp_h_samp[i] << 4) + m_comp_v_samp[i]);  /* h and v sampling */
			emit_byte(i > 0);                                   /* quant. table num */
		}
	}